

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O0

void CreateNewEntry<Assimp::LWO::WeightChannel>(WeightChannel *chan,uint srcIdx)

{
  VMapEntry *pVVar1;
  long lVar2;
  size_type sVar3;
  reference __x;
  uint local_2c;
  undefined1 auStack_28 [4];
  uint a;
  uint local_14;
  WeightChannel *pWStack_10;
  uint srcIdx_local;
  WeightChannel *chan_local;
  
  local_14 = srcIdx;
  pWStack_10 = chan;
  lVar2 = std::__cxx11::string::length();
  if (lVar2 != 0) {
    _auStack_28 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            (&(pWStack_10->super_VMapEntry).abAssigned,(ulong)local_14);
    std::_Bit_reference::operator=((_Bit_reference *)auStack_28,true);
    pVVar1 = &pWStack_10->super_VMapEntry;
    sVar3 = std::vector<bool,_std::allocator<bool>_>::size
                      (&(pWStack_10->super_VMapEntry).abAssigned);
    std::vector<bool,_std::allocator<bool>_>::resize(&pVVar1->abAssigned,sVar3 + 1,false);
    for (local_2c = 0; local_2c < (pWStack_10->super_VMapEntry).dims; local_2c = local_2c + 1) {
      pVVar1 = &pWStack_10->super_VMapEntry;
      __x = std::vector<float,_std::allocator<float>_>::operator[]
                      (&(pWStack_10->super_VMapEntry).rawData,
                       (ulong)(local_14 * (pWStack_10->super_VMapEntry).dims + local_2c));
      std::vector<float,_std::allocator<float>_>::push_back(&pVVar1->rawData,__x);
    }
  }
  return;
}

Assistant:

inline void CreateNewEntry(T& chan, unsigned int srcIdx)
{
    if (!chan.name.length())
        return;

    chan.abAssigned[srcIdx] = true;
    chan.abAssigned.resize(chan.abAssigned.size()+1,false);

    for (unsigned int a = 0; a < chan.dims;++a)
        chan.rawData.push_back(chan.rawData[srcIdx*chan.dims+a]);
}